

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

size_t lodepng_get_raw_size(uint w,uint h,LodePNGColorMode *color)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = 0;
  if ((ulong)color->colortype < 7) {
    iVar1 = *(int *)(&DAT_00113c24 + (ulong)color->colortype * 4);
  }
  uVar2 = (ulong)(iVar1 * color->bitdepth);
  return ((h * w & 7) * uVar2 + 7 >> 3) + (h * w >> 3) * uVar2;
}

Assistant:

size_t lodepng_get_raw_size(unsigned w, unsigned h, const LodePNGColorMode* color)
{
  /*will not overflow for any color type if roughly w * h < 268435455*/
  size_t bpp = lodepng_get_bpp(color);
  size_t n = w * h;
  return ((n / 8) * bpp) + ((n & 7) * bpp + 7) / 8;
}